

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O2

void Abc_NtkDfs_iter(Vec_Ptr_t *vStack,Abc_Obj_t *pRoot,Vec_Ptr_t *vNodes)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  long *Entry;
  Abc_Obj_t *p;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pRoot);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pRoot);
    uVar2 = *(uint *)&pRoot->field_0x14 & 0xf;
    if ((uVar2 != 2) && (uVar2 != 5)) {
      if ((pRoot->pNtk->ntkType == ABC_NTK_STRASH) &&
         (iVar1 = Abc_AigNodeIsConst(pRoot), iVar1 != 0)) {
        return;
      }
      vStack->nSize = 0;
      Vec_PtrPush(vStack,pRoot);
      Vec_PtrPush(vStack,(void *)0x0);
      while (0 < vStack->nSize) {
        pvVar3 = Vec_PtrPop(vStack);
        Entry = (long *)Vec_PtrPop(vStack);
        if ((*(uint *)((long)Entry + 0x14) & 0xf) == 6) {
          __assert_fail("!Abc_ObjIsNet(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                        ,0x218,"void Abc_NtkDfs_iter(Vec_Ptr_t *, Abc_Obj_t *, Vec_Ptr_t *)");
        }
        if (*(int *)((long)Entry + 0x1c) == (int)pvVar3) {
          Vec_PtrPush(vNodes,Entry);
        }
        else {
          Vec_PtrPush(vStack,Entry);
          Vec_PtrPush(vStack,(void *)(((long)pvVar3 << 0x20) + 0x100000000 >> 0x20));
          p = Abc_ObjFanin0Ntk(*(Abc_Obj_t **)
                                (*(long *)(*(long *)(*Entry + 0x20) + 8) +
                                (long)*(int *)(Entry[4] + (((long)pvVar3 << 0x20) >> 0x1e)) * 8));
          iVar1 = Abc_NodeIsTravIdCurrent(p);
          if (iVar1 == 0) {
            Abc_NodeSetTravIdCurrent(p);
            uVar2 = *(uint *)&p->field_0x14 & 0xf;
            if (((uVar2 != 2) && (uVar2 != 5)) &&
               ((p->pNtk->ntkType != ABC_NTK_STRASH || (iVar1 = Abc_AigNodeIsConst(p), iVar1 == 0)))
               ) {
              Vec_PtrPush(vStack,p);
              Vec_PtrPush(vStack,(void *)0x0);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkDfs_iter( Vec_Ptr_t * vStack, Abc_Obj_t * pRoot, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pNode, * pFanin;
    int iFanin;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pRoot ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pRoot );
    // skip the CI
    if ( Abc_ObjIsCi(pRoot) || (Abc_NtkIsStrash(pRoot->pNtk) && Abc_AigNodeIsConst(pRoot)) )
        return;
    // add the CI
    Vec_PtrClear( vStack );
    Vec_PtrPush( vStack, pRoot );
    Vec_PtrPush( vStack, (void *)0 );
    while ( Vec_PtrSize(vStack) > 0 )
    {
        // get the node and its fanin
        iFanin = (int)(ABC_PTRINT_T)Vec_PtrPop(vStack);
        pNode  = (Abc_Obj_t *)Vec_PtrPop(vStack);
        assert( !Abc_ObjIsNet(pNode) );
        // add it to the array of nodes if we finished
        if ( iFanin == Abc_ObjFaninNum(pNode) )
        {
            Vec_PtrPush( vNodes, pNode );
            continue;
        }
        // explore the next fanin
        Vec_PtrPush( vStack, pNode );
        Vec_PtrPush( vStack, (void *)(ABC_PTRINT_T)(iFanin+1) );
        // get the fanin
        pFanin = Abc_ObjFanin0Ntk( Abc_ObjFanin(pNode,iFanin) );
        // if this node is already visited, skip
        if ( Abc_NodeIsTravIdCurrent( pFanin ) )
            continue;
        // mark the node as visited
        Abc_NodeSetTravIdCurrent( pFanin );
        // skip the CI
        if ( Abc_ObjIsCi(pFanin) || (Abc_NtkIsStrash(pFanin->pNtk) && Abc_AigNodeIsConst(pFanin)) )
            continue;
        Vec_PtrPush( vStack, pFanin );
        Vec_PtrPush( vStack, (void *)0 );   
    }
}